

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001b3240 = 0x2d2d2d2d2d2d2d;
    uRam00000000001b3247._0_1_ = '-';
    uRam00000000001b3247._1_1_ = '-';
    uRam00000000001b3247._2_1_ = '-';
    uRam00000000001b3247._3_1_ = '-';
    uRam00000000001b3247._4_1_ = '-';
    uRam00000000001b3247._5_1_ = '-';
    uRam00000000001b3247._6_1_ = '-';
    uRam00000000001b3247._7_1_ = '-';
    DAT_001b3230 = '-';
    DAT_001b3230_1._0_1_ = '-';
    DAT_001b3230_1._1_1_ = '-';
    DAT_001b3230_1._2_1_ = '-';
    DAT_001b3230_1._3_1_ = '-';
    DAT_001b3230_1._4_1_ = '-';
    DAT_001b3230_1._5_1_ = '-';
    DAT_001b3230_1._6_1_ = '-';
    uRam00000000001b3238 = 0x2d2d2d2d2d2d2d;
    DAT_001b323f = 0x2d;
    DAT_001b3220 = '-';
    DAT_001b3220_1._0_1_ = '-';
    DAT_001b3220_1._1_1_ = '-';
    DAT_001b3220_1._2_1_ = '-';
    DAT_001b3220_1._3_1_ = '-';
    DAT_001b3220_1._4_1_ = '-';
    DAT_001b3220_1._5_1_ = '-';
    DAT_001b3220_1._6_1_ = '-';
    uRam00000000001b3228._0_1_ = '-';
    uRam00000000001b3228._1_1_ = '-';
    uRam00000000001b3228._2_1_ = '-';
    uRam00000000001b3228._3_1_ = '-';
    uRam00000000001b3228._4_1_ = '-';
    uRam00000000001b3228._5_1_ = '-';
    uRam00000000001b3228._6_1_ = '-';
    uRam00000000001b3228._7_1_ = '-';
    DAT_001b3210 = '-';
    DAT_001b3210_1._0_1_ = '-';
    DAT_001b3210_1._1_1_ = '-';
    DAT_001b3210_1._2_1_ = '-';
    DAT_001b3210_1._3_1_ = '-';
    DAT_001b3210_1._4_1_ = '-';
    DAT_001b3210_1._5_1_ = '-';
    DAT_001b3210_1._6_1_ = '-';
    uRam00000000001b3218._0_1_ = '-';
    uRam00000000001b3218._1_1_ = '-';
    uRam00000000001b3218._2_1_ = '-';
    uRam00000000001b3218._3_1_ = '-';
    uRam00000000001b3218._4_1_ = '-';
    uRam00000000001b3218._5_1_ = '-';
    uRam00000000001b3218._6_1_ = '-';
    uRam00000000001b3218._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001b3208._0_1_ = '-';
    uRam00000000001b3208._1_1_ = '-';
    uRam00000000001b3208._2_1_ = '-';
    uRam00000000001b3208._3_1_ = '-';
    uRam00000000001b3208._4_1_ = '-';
    uRam00000000001b3208._5_1_ = '-';
    uRam00000000001b3208._6_1_ = '-';
    uRam00000000001b3208._7_1_ = '-';
    DAT_001b324f = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}